

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack9_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar2 = *(ulong *)in;
  auVar8._8_4_ = 0x1ff;
  auVar8._0_8_ = 0x1ff000001ff;
  auVar8._12_4_ = 0x1ff;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7 = vpshufd_avx(auVar7,0x40);
  *out = (uint)uVar2 & 0x1ff;
  uVar1 = in[2];
  auVar4 = vpsrlvd_avx2(auVar7,_DAT_001aa1e0);
  auVar6 = vpbroadcastd_avx512vl();
  uVar5 = (uint)(uVar2 >> 0x20);
  auVar7 = vpinsrd_avx(auVar8,(uVar5 & 0xf) << 5,2);
  auVar3 = vpor_avx(auVar4,auVar7);
  auVar7 = vpand_avx(auVar4,auVar8);
  auVar7 = vpblendd_avx2(auVar7,auVar3,4);
  *(undefined1 (*) [16])(out + 1) = auVar7;
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_0019e530);
  auVar7 = vpand_avx(auVar7,auVar8);
  *(long *)(out + 5) = auVar7._0_8_;
  out[7] = (uVar1 & 0xff) << 1 | uVar5 >> 0x1f;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack9_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 9);
  out++;
  *out = ((*in) >> 9) % (1U << 9);
  out++;
  *out = ((*in) >> 18) % (1U << 9);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 4)) << (9 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 9);
  out++;
  *out = ((*in) >> 13) % (1U << 9);
  out++;
  *out = ((*in) >> 22) % (1U << 9);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 8)) << (9 - 8);
  out++;

  return in + 1;
}